

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtGImpactCollisionAlgorithm::convex_vs_convex_collision
          (cbtGImpactCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtCollisionShape *shape0,cbtCollisionShape *shape1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cbtCollisionObjectWrapper local_80;
  cbtCollisionObjectWrapper local_58;
  
  (*(this->m_resultOut->super_Result)._vptr_Result[2])
            (this->m_resultOut,(ulong)(uint)this->m_part0,(ulong)(uint)this->m_triface0);
  (*(this->m_resultOut->super_Result)._vptr_Result[3])
            (this->m_resultOut,(ulong)(uint)this->m_part1,(ulong)(uint)this->m_triface1);
  local_58.m_collisionObject = body0Wrap->m_collisionObject;
  local_58.m_worldTransform = body0Wrap->m_worldTransform;
  uVar1 = this->m_triface0;
  uVar3 = this->m_part0;
  auVar5._4_4_ = uVar3;
  auVar5._0_4_ = uVar1;
  auVar5._8_8_ = 0;
  auVar5 = vshufps_avx(auVar5,auVar5,0xe1);
  local_58._32_8_ = vmovlps_avx(auVar5);
  local_80.m_collisionObject = body1Wrap->m_collisionObject;
  local_80.m_worldTransform = body1Wrap->m_worldTransform;
  uVar2 = this->m_triface1;
  uVar4 = this->m_part1;
  auVar6._4_4_ = uVar4;
  auVar6._0_4_ = uVar2;
  auVar6._8_8_ = 0;
  auVar5 = vshufps_avx(auVar6,auVar6,0xe1);
  local_80._32_8_ = vmovlps_avx(auVar5);
  local_80.m_parent = body1Wrap;
  local_80.m_shape = shape1;
  local_58.m_parent = body0Wrap;
  local_58.m_shape = shape0;
  checkConvexAlgorithm(this,&local_58,&local_80);
  (*this->m_convex_algorithm->_vptr_cbtCollisionAlgorithm[2])
            (this->m_convex_algorithm,&local_58,&local_80,this->m_dispatchInfo,this->m_resultOut);
  return;
}

Assistant:

void cbtGImpactCollisionAlgorithm::convex_vs_convex_collision(
	const cbtCollisionObjectWrapper* body0Wrap,
	const cbtCollisionObjectWrapper* body1Wrap,
	const cbtCollisionShape* shape0,
	const cbtCollisionShape* shape1)
{
	m_resultOut->setShapeIdentifiersA(m_part0, m_triface0);
	m_resultOut->setShapeIdentifiersB(m_part1, m_triface1);

	cbtCollisionObjectWrapper ob0(body0Wrap, shape0, body0Wrap->getCollisionObject(), body0Wrap->getWorldTransform(), m_part0, m_triface0);
	cbtCollisionObjectWrapper ob1(body1Wrap, shape1, body1Wrap->getCollisionObject(), body1Wrap->getWorldTransform(), m_part1, m_triface1);
	checkConvexAlgorithm(&ob0, &ob1);
	m_convex_algorithm->processCollision(&ob0, &ob1, *m_dispatchInfo, m_resultOut);
}